

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void expandFormatArguments<String>(vector<String,_std::allocator<String>_> *data,String *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  value_type local_38;
  
  paVar1 = &local_38._string.field_2;
  pcVar2 = (arg->_string)._M_dataplus._M_p;
  local_38._string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (arg->_string)._M_string_length);
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._string._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}